

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O2

void Mini_LutPush(Mini_Lut_t *p,int nVars,int *pVars,uint *pTruth)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int nCapMin;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *__assertion;
  ulong uVar8;
  
  iVar2 = p->LutSize;
  bVar4 = (byte)(iVar2 - 5U) & 0x1f;
  iVar3 = p->nSize;
  uVar7 = 0;
  uVar6 = 1 << bVar4;
  if (1 << bVar4 < 1) {
    uVar6 = 0;
  }
  if (iVar3 == p->nCap) {
    if (0x3ffffffe < iVar3 * iVar2) {
      __assertion = "p->LutSize*p->nSize < MINI_LUT_NULL/2";
      uVar6 = 0x5d;
      goto LAB_006021d3;
    }
    nCapMin = iVar3 * 2;
    if (iVar3 < 0xff) {
      nCapMin = 0xff;
    }
    Mini_LutGrow(p,nCapMin);
  }
  uVar5 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar5 == uVar7) {
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        p->pArray[(long)p->nSize * (long)p->LutSize + uVar7] = pVars[uVar7];
      }
      for (; (int)uVar5 < p->LutSize; uVar5 = uVar5 + 1) {
        p->pArray[(long)p->nSize * (long)p->LutSize + uVar5] = 0x7fffffff;
      }
      uVar5 = 0;
      uVar7 = (ulong)(iVar2 - 5U);
      if (iVar2 < 6) {
        uVar7 = uVar5;
      }
      uVar8 = 1;
      if (5 < iVar2) {
        uVar8 = (ulong)uVar6;
      }
      for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        if (pTruth == (uint *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = pTruth[uVar5];
        }
        p->pTruths[(long)(p->nSize << ((byte)uVar7 & 0x1f)) + uVar5] = uVar6;
      }
      p->nSize = p->nSize + 1;
      return;
    }
    piVar1 = pVars + uVar7;
  } while ((-1 < *piVar1) && (uVar7 = uVar7 + 1, *piVar1 < p->nSize));
  __assertion = "pVars[i] >= 0 && pVars[i] < p->nSize";
  uVar6 = 100;
LAB_006021d3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                ,uVar6,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
}

Assistant:

static void Mini_LutPush( Mini_Lut_t * p, int nVars, int * pVars, unsigned * pTruth )
{
    int i, nWords = Mini_LutWordNum(p->LutSize);
    if ( p->nSize == p->nCap )
    {
        assert( p->LutSize*p->nSize < MINI_LUT_NULL/2 );
        if ( p->nCap < MINI_LUT_START_SIZE )
            Mini_LutGrow( p, MINI_LUT_START_SIZE );
        else
            Mini_LutGrow( p, 2 * p->nCap );
    }
    for ( i = 0; i < nVars; i++ )
        assert( pVars[i] >= 0 && pVars[i] < p->nSize );
    for ( i = 0; i < nVars; i++ )
        p->pArray[p->LutSize * p->nSize + i] = pVars[i];
    for ( ; i < p->LutSize; i++ )
        p->pArray[p->LutSize * p->nSize + i] = MINI_LUT_NULL;
    for ( i = 0; i < nWords; i++ )
        p->pTruths[nWords * p->nSize + i] = pTruth? pTruth[i] : 0;
    p->nSize++;
}